

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O2

void * lace_worker_thread(void *arg)

{
  ushort uVar1;
  WorkerP *self;
  uint uVar2;
  uint uVar3;
  Task *__dq_head;
  Worker **ppWVar4;
  uint uVar5;
  uint uVar6;
  Worker **ppWVar7;
  Worker **ppWVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  
  lace_init_worker((uint)arg);
  sem_wait((sem_t *)&suspend_semaphore);
  LOCK();
  workers_running = workers_running + 1;
  UNLOCK();
  self = *(WorkerP **)(in_FS_OFFSET + -8);
  __dq_head = lace_get_head(self);
  uVar2 = n_workers;
  uVar1 = self->worker;
  uVar6 = (uint)uVar1;
  uVar9 = (ulong)n_workers;
  uVar5 = 0;
  ppWVar4 = (Worker **)((ulong)((uint)uVar1 * 8) + (long)workers);
  uVar3 = n_workers - 1;
  ppWVar8 = ppWVar4;
  while (lace_quits == 0) {
    if (1 < uVar2) {
      if ((int)uVar5 < 1) {
        uVar5 = (uVar6 * 0x41c64e6d + 0x3039) % 0x28;
        uVar6 = uVar6 * -0x3d5d6597 + 0xd3dc167e;
        ppWVar8 = workers + (ulong)(uVar1 + 1 + uVar6 % uVar3) % (ulong)uVar2;
      }
      else {
        uVar5 = uVar5 - 1;
        ppWVar7 = ppWVar8 + 2;
        if (ppWVar8 + 1 != ppWVar4) {
          ppWVar7 = ppWVar8 + 1;
        }
        if (workers + uVar9 <= ppWVar7) {
          ppWVar7 = workers;
        }
        ppWVar8 = ppWVar7 + (ppWVar7 == ppWVar4);
      }
      lace_steal(self,__dq_head,*ppWVar8);
    }
    if (lace_newframe.t != (Task *)0x0) {
      lace_yield(self,__dq_head);
    }
    if (external_task != (ExtTask *)0x0) {
      lace_steal_external(self,__dq_head);
    }
    if (must_suspend != 0) {
      LOCK();
      workers_running = workers_running - 1;
      UNLOCK();
      sem_wait((sem_t *)&suspend_semaphore);
      lace_barrier();
      LOCK();
      workers_running = workers_running + 1;
      UNLOCK();
    }
  }
  LOCK();
  workers_running = workers_running - 1;
  UNLOCK();
  return (void *)0x0;
}

Assistant:

static void*
lace_worker_thread(void* arg)
{
    int worker = (int)(size_t)arg;

    // Initialize data structures
    lace_init_worker(worker);

    // Pin CPU
    lace_pin_worker();

    // Wait for the first time we are resumed
    sem_wait(&suspend_semaphore);

    // Signal that we are running
    workers_running += 1;

    // Run the steal loop
    WorkerP *__lace_worker = lace_get_worker();
    Task *__lace_dq_head = lace_get_head(__lace_worker);
    lace_steal_loop_WORK(__lace_worker, __lace_dq_head, &lace_quits);

    // Time worker exit event
    lace_time_event(__lace_worker, 9);

    // Signal that we stopped
    workers_running -= 1;

    return NULL;
}